

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

MetadataResult SetPrompt(ShellState *param_1,char **azArg,idx_t nArg)

{
  ulong in_RDX;
  long in_RSI;
  
  if (1 < in_RDX) {
    strncpy(mainPrompt,*(char **)(in_RSI + 8),0x13);
  }
  if (2 < in_RDX) {
    strncpy(continuePrompt,*(char **)(in_RSI + 0x10),0x13);
  }
  if (3 < in_RDX) {
    strncpy(continuePromptSelected,*(char **)(in_RSI + 0x18),0x13);
  }
  return SUCCESS;
}

Assistant:

MetadataResult SetPrompt(ShellState &, const char **azArg, idx_t nArg) {
	if (nArg >= 2) {
		strncpy(mainPrompt, azArg[1], (int)ArraySize(mainPrompt) - 1);
	}
	if (nArg >= 3) {
		strncpy(continuePrompt, azArg[2], (int)ArraySize(continuePrompt) - 1);
	}
	if (nArg >= 4) {
		strncpy(continuePromptSelected, azArg[3], (int)ArraySize(continuePromptSelected) - 1);
	}
	return MetadataResult::SUCCESS;
}